

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  App *pAVar1;
  ostream *poVar2;
  allocator local_4ea;
  allocator local_4e9;
  shared_ptr<MyFormatter> fmt;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  __shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2> local_3e8;
  string local_3d8;
  string local_3b8;
  string local_398;
  App app;
  
  std::__cxx11::string::string((string *)&local_398,"",(allocator *)&fmt);
  std::__cxx11::string::string((string *)&local_3b8,"",&local_4ea);
  CLI::App::App(&app,&local_398,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::string((string *)&local_3d8,"--help-all",&local_4ea);
  std::__cxx11::string::string((string *)&fmt,"Show all help",&local_4e9);
  CLI::App::set_help_all_flag(&app,&local_3d8,(string *)&fmt);
  std::__cxx11::string::~string((string *)&fmt);
  std::__cxx11::string::~string((string *)&local_3d8);
  CLI::std::make_shared<MyFormatter>();
  ((fmt.super___shared_ptr<MyFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Formatter).
  super_FormatterBase.column_width_ = 0xf;
  std::__shared_ptr<CLI::FormatterBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<MyFormatter,void>
            ((__shared_ptr<CLI::FormatterBase,(__gnu_cxx::_Lock_policy)2> *)&local_3e8,
             &fmt.super___shared_ptr<MyFormatter,_(__gnu_cxx::_Lock_policy)2>);
  CLI::std::__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&app.formatter_.super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>,
             &local_3e8);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3e8._M_refcount);
  std::__cxx11::string::string((string *)&local_408,"--flag",&local_4ea);
  CLI::App::add_flag<const_char[15],_(CLI::detail::enabler)0>
            (&app,&local_408,(char (*) [15])"This is a flag");
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::string((string *)&local_428,"one",&local_4ea);
  std::__cxx11::string::string((string *)&local_448,"Description One",&local_4e9);
  pAVar1 = CLI::App::add_subcommand(&app,&local_428,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::string((string *)&local_468,"--oneflag",&local_4ea);
  CLI::App::add_flag<const_char[10],_(CLI::detail::enabler)0>
            (pAVar1,&local_468,(char (*) [10])"Some flag");
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::string((string *)&local_488,"two",&local_4ea);
  std::__cxx11::string::string((string *)&local_4a8,"Description Two",&local_4e9);
  pAVar1 = CLI::App::add_subcommand(&app,&local_488,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::string((string *)&local_4c8,"--twoflag",&local_4ea);
  CLI::App::add_flag<const_char[16],_(CLI::detail::enabler)0>
            (pAVar1,&local_4c8,(char (*) [16])"Some other flag");
  std::__cxx11::string::~string((string *)&local_4c8);
  CLI::App::parse_char_t<char>(&app,argc,argv);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "This app was meant to show off the formatter, run with -h");
  std::operator<<(poVar2,'\n');
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fmt.super___shared_ptr<MyFormatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  CLI::App::~App(&app);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    CLI::App app;
    app.set_help_all_flag("--help-all", "Show all help");

    auto fmt = std::make_shared<MyFormatter>();
    fmt->column_width(15);
    app.formatter(fmt);

    app.add_flag("--flag", "This is a flag");

    auto *sub1 = app.add_subcommand("one", "Description One");
    sub1->add_flag("--oneflag", "Some flag");
    auto *sub2 = app.add_subcommand("two", "Description Two");
    sub2->add_flag("--twoflag", "Some other flag");

    CLI11_PARSE(app, argc, argv);

    std::cout << "This app was meant to show off the formatter, run with -h" << '\n';

    return 0;
}